

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

CECoordinates * __thiscall
CECoordinates::ConvertToCIRS
          (CECoordinates *this,double jd,double longitude,double latitude,double elevation_m,
          double pressure_hPa,double temperature_celsius,double relative_humidity,double dut1,
          double xp,double yp,double wavelength_um)

{
  long *in_RSI;
  CECoordinates *in_RDI;
  double glat;
  double *in_stack_00000008;
  CEAngle *in_stack_00000010;
  CECoordinateType *in_stack_00000018;
  double ycoord_new;
  double xcoord_new;
  double *in_stack_fffffffffffffe68;
  CEAngle *in_stack_fffffffffffffe70;
  CECoordinateType *in_stack_fffffffffffffe78;
  CEDate *in_stack_fffffffffffffe80;
  CEAngle *in_stack_fffffffffffffe88;
  CECoordinates *in_stack_fffffffffffffe90;
  undefined1 *glon;
  double in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  double in_stack_ffffffffffffff18;
  double in_stack_ffffffffffffff20;
  CEAngleType *in_stack_ffffffffffffff28;
  CEDate *in_stack_ffffffffffffff30;
  double *in_stack_ffffffffffffff38;
  double *in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  double in_stack_ffffffffffffff50;
  double in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  
  if ((int)in_RSI[5] == 0) {
    CppEphem::julian_date_J2000();
    (**(code **)(*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)(*in_RSI + 0x38))();
  }
  else if ((int)in_RSI[5] == 1) {
    CppEphem::julian_date_J2000();
    (**(code **)(*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)(*in_RSI + 0x38))();
    CEDate::CEDate(in_stack_fffffffffffffe80,(double)in_stack_fffffffffffffe78,
                   (CEDateType)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    ICRS2CIRS(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
              in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    CEDate::~CEDate((CEDate *)0x129972);
  }
  else if ((int)in_RSI[5] == 2) {
    CppEphem::julian_date_J2000();
    in_stack_fffffffffffffe90 = (CECoordinates *)(**(code **)(*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    glat = (double)(**(code **)(*in_RSI + 0x38))();
    glon = &stack0xffffffffffffff08;
    CEDate::CEDate(in_stack_fffffffffffffe80,(double)in_stack_fffffffffffffe78,
                   (CEDateType)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    Galactic2CIRS((double)glon,glat,(double *)in_stack_fffffffffffffe90,
                  (double *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                  in_stack_fffffffffffffe78);
    CEDate::~CEDate((CEDate *)0x129a43);
  }
  else if ((int)in_RSI[5] == 3) {
    CppEphem::julian_date_J2000();
    in_stack_fffffffffffffe88 = (CEAngle *)(**(code **)(*in_RSI + 0x28))();
    CppEphem::julian_date_J2000();
    (**(code **)(*in_RSI + 0x38))();
    Observed2CIRS(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                  in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30,
                  (double)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                  in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                  in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
                  in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
    in_stack_fffffffffffffe68 = in_stack_00000008;
    in_stack_fffffffffffffe70 = in_stack_00000010;
    in_stack_fffffffffffffe78 = in_stack_00000018;
  }
  CEAngle::CEAngle(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  CEAngle::CEAngle(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  CECoordinates(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                (CEAngle *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  CEAngle::~CEAngle((CEAngle *)0x129bb9);
  CEAngle::~CEAngle((CEAngle *)0x129bc6);
  return in_RDI;
}

Assistant:

CECoordinates CECoordinates::ConvertToCIRS(double jd,
                            double longitude,
                            double latitude,
                            double elevation_m,
                            double pressure_hPa,
                            double temperature_celsius,
                            double relative_humidity,
                            double dut1,
                            double xp, double yp,
                            double wavelength_um)
{
    double xcoord_new(0.0);
    double ycoord_new(0.0) ;
    if (coord_type_ == CECoordinateType::CIRS) {
        // CIRS -> CIRS
        xcoord_new = XCoordinate_Rad() ;
        ycoord_new = YCoordinate_Rad() ;
    } else if (coord_type_ == CECoordinateType::ICRS) {
        // ICRS -> CIRS
        ICRS2CIRS(XCoordinate_Rad(), YCoordinate_Rad(),
                  &xcoord_new, &ycoord_new,
                  jd, CEAngleType::RADIANS) ;
    } else if (coord_type_ == CECoordinateType::GALACTIC) {
        // Galactic -> CIRS
        Galactic2CIRS(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd, CEAngleType::RADIANS) ;
    } else if (coord_type_ == CECoordinateType::OBSERVED) {
        // Observed -> CIRS
        Observed2CIRS(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd, longitude, latitude,
                      elevation_m, pressure_hPa,
                      temperature_celsius, relative_humidity,
                      dut1, xp, yp, wavelength_um) ;
    }
    
    return CECoordinates(xcoord_new, 
                         ycoord_new,
                         CECoordinateType::CIRS) ;
}